

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O1

void __thiscall
OpenSteer::OpenSteerDemo::drawCircleHighlightOnVehicle
          (OpenSteerDemo *this,AbstractVehicle *v,float radiusMultiplier,Color *color)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float in_XMM1_Da;
  Vec3 local_48;
  Vec3 local_38;
  undefined1 local_28 [24];
  
  fVar1 = camera.super_LocalSpace._position.z;
  if (this != (OpenSteerDemo *)0x0) {
    local_28._0_8_ = camera.super_LocalSpace._position._0_8_;
    local_28._8_8_ = 0;
    fVar2 = (float)(**(code **)(*(long *)this + 0xc0))();
    local_38._0_8_ = (**(code **)(*(long *)this + 0x40))(this);
    uVar3 = (**(code **)(*(long *)this + 0x40))(this);
    local_48.z = in_XMM1_Da - fVar1;
    local_48.y = (float)((ulong)uVar3 >> 0x20) - (float)local_28._4_4_;
    local_48.x = (float)uVar3 - (float)local_28._0_4_;
    if (updatePhaseActive == '\x01') {
      warnIfInUpdatePhase2("draw3dCircle");
    }
    draw3dCircleOrDisk(fVar2 * radiusMultiplier,&local_38,&local_48,(Color *)v,0x14,false);
  }
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::drawCircleHighlightOnVehicle (const AbstractVehicle* v,
                                                  const float radiusMultiplier,
                                                  const Color& color)
{
    if (v)
    {
        const Vec3& cPosition = camera.position();
        draw3dCircle  (v->radius() * radiusMultiplier,  // adjusted radius
                       v->position(),                   // center
                       v->position() - cPosition,       // view axis
                       color,                          // drawing color
                       20);                            // circle segments
    }
}